

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_uint_vector.h
# Opt level: O2

size_t __thiscall
s2coding::EncodedUintVector<unsigned_int>::lower_bound
          (EncodedUintVector<unsigned_int> *this,uint target)

{
  size_t sVar1;
  S2LogMessage SStack_18;
  
  switch(this->len_) {
  case '\x01':
    sVar1 = lower_bound<1>(this,target);
    return sVar1;
  case '\x02':
    sVar1 = lower_bound<2>(this,target);
    return sVar1;
  case '\x03':
    sVar1 = lower_bound<3>(this,target);
    return sVar1;
  case '\x04':
    sVar1 = lower_bound<4>(this,target);
    return sVar1;
  default:
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_uint_vector.h"
               ,0xfd,kFatal,(ostream *)&std::cerr);
    std::operator<<(SStack_18.stream_,"Check failed: len_ >= 1 && len_ <= sizeof(T) ");
    abort();
  }
}

Assistant:

size_t EncodedUintVector<T>::lower_bound(T target) const {
  static_assert(sizeof(T) & 0xe, "Unsupported integer length");
  S2_DCHECK(len_ >= 1 && len_ <= sizeof(T));

  // TODO(ericv): Consider using the unused 28 bits of "len_" to store the
  // last result of lower_bound() to be used as a hint.  This should help in
  // common situation where the same element is looked up repeatedly.  This
  // would require declaring the new field (length_lower_bound_hint_) as
  // mutable std::atomic<uint32> (accessed using std::memory_order_relaxed)
  // with a custom copy constructor that resets the hint component to zero.
  switch (len_) {
    case 1: return lower_bound<1>(target);
    case 2: return lower_bound<2>(target);
    case 3: return lower_bound<3>(target);
    case 4: return lower_bound<4>(target);
    case 5: return lower_bound<5>(target);
    case 6: return lower_bound<6>(target);
    case 7: return lower_bound<7>(target);
    default: return lower_bound<8>(target);
  }
}